

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_array_value(char **string,size_t nesting)

{
  JSON_Status JVar1;
  JSON_Array *array;
  ushort **ppuVar2;
  JSON_Value *value;
  size_t new_capacity;
  JSON_Array *output_array;
  JSON_Value *new_array_value;
  JSON_Value *output_value;
  size_t nesting_local;
  char **string_local;
  
  string_local = (char **)json_value_init_array();
  if ((JSON_Value *)string_local == (JSON_Value *)0x0) {
    string_local = (char **)0x0;
  }
  else if (**string == '[') {
    array = json_value_get_array((JSON_Value *)string_local);
    *string = *string + 1;
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)**string] & 0x2000) != 0) {
      *string = *string + 1;
    }
    if (**string == ']') {
      *string = *string + 1;
    }
    else {
      do {
        if (**string == '\0') break;
        value = parse_value(string,nesting);
        if (value == (JSON_Value *)0x0) {
          json_value_free((JSON_Value *)string_local);
          return (JSON_Value *)0x0;
        }
        JVar1 = json_array_add(array,value);
        if (JVar1 != 0) {
          json_value_free(value);
          json_value_free((JSON_Value *)string_local);
          return (JSON_Value *)0x0;
        }
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)**string] & 0x2000) != 0) {
          *string = *string + 1;
        }
        if (**string != ',') break;
        *string = *string + 1;
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)**string] & 0x2000) != 0) {
          *string = *string + 1;
        }
      } while (**string != ']');
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(uint)(byte)**string] & 0x2000) != 0) {
        *string = *string + 1;
      }
      if (**string == ']') {
        new_capacity = json_array_get_count(array);
        JVar1 = json_array_resize(array,new_capacity);
        if (JVar1 == 0) {
          *string = *string + 1;
          return (JSON_Value *)string_local;
        }
      }
      json_value_free((JSON_Value *)string_local);
      string_local = (char **)0x0;
    }
  }
  else {
    json_value_free((JSON_Value *)string_local);
    string_local = (char **)0x0;
  }
  return (JSON_Value *)string_local;
}

Assistant:

static JSON_Value * parse_array_value(const char **string, size_t nesting) {
    JSON_Value *output_value = NULL, *new_array_value = NULL;
    JSON_Array *output_array = NULL;
    output_value = json_value_init_array();
    if (output_value == NULL) {
        return NULL;
    }
    if (**string != '[') {
        json_value_free(output_value);
        return NULL;
    }
    output_array = json_value_get_array(output_value);
    SKIP_CHAR(string);
    SKIP_WHITESPACES(string);
    if (**string == ']') { /* empty array */
        SKIP_CHAR(string);
        return output_value;
    }
    while (**string != '\0') {
        new_array_value = parse_value(string, nesting);
        if (new_array_value == NULL) {
            json_value_free(output_value);
            return NULL;
        }
        if (json_array_add(output_array, new_array_value) != JSONSuccess) {
            json_value_free(new_array_value);
            json_value_free(output_value);
            return NULL;
        }
        SKIP_WHITESPACES(string);
        if (**string != ',') {
            break;
        }
        SKIP_CHAR(string);
        SKIP_WHITESPACES(string);
        if (**string == ']') {
            break;
        }
    }
    SKIP_WHITESPACES(string);
    if (**string != ']' || /* Trim array after parsing is over */
        json_array_resize(output_array, json_array_get_count(output_array)) != JSONSuccess) {
            json_value_free(output_value);
            return NULL;
    }
    SKIP_CHAR(string);
    return output_value;
}